

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O3

void __thiscall
kainjow::mustache::
parser<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::
parse(parser<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      *this,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *input,
     context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
     *ctx,component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          *root_component,
     basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *error_message)

{
  wchar_t wVar1;
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *pcVar2;
  pointer pwVar3;
  pointer pcVar4;
  context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *pcVar5;
  pointer pbVar6;
  bool bVar7;
  int iVar8;
  walk_control wVar9;
  wstring *pwVar10;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pbVar11;
  delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *pdVar12;
  wostream *pwVar13;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pbVar14;
  undefined8 uVar15;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s;
  ulong uVar16;
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *child;
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *pcVar17;
  pointer pbVar18;
  pointer pcVar19;
  ulong uVar20;
  size_type sVar21;
  long lVar22;
  initializer_list<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>
  __l;
  initializer_list<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __l_00;
  string_size_type input_position;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> tag_contents;
  vector<unsigned_long,_std::allocator<unsigned_long>_> section_starts;
  vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
  sections;
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  comp;
  string_size_type current_text_position;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> current_text;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  brace_delimiter_end_unescaped;
  anon_class_24_3_f3e5c141 process_current_text;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  whitespace;
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  comp_1;
  bool local_379;
  pointer local_378;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_370;
  undefined4 local_364;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_360;
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *local_340;
  delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *local_338;
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *local_330;
  void *local_328;
  iterator iStack_320;
  unsigned_long *local_318;
  vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
  local_308;
  undefined1 local_2f0 [88];
  element_type *local_298;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_290;
  vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  local_288;
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *local_270;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_268;
  context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *local_260;
  parser<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *local_258;
  pointer local_250;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_248;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_228;
  long *local_208 [2];
  long local_1f8 [2];
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *local_1e8;
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *local_1e0;
  anon_class_24_3_f3e5c141 local_1d8;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_1c0;
  _Any_data local_1a8;
  undefined1 local_198 [64];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_158;
  element_type *local_150;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_148;
  undefined1 local_140 [8];
  undefined1 auStack_138 [16];
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *local_128 [2];
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_118;
  
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_340 = (component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *)error_message;
  local_258 = this;
  std::__cxx11::wstring::_M_construct((ulong)&local_228,L'\x03');
  pcVar17 = (component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             *)input->_M_string_length;
  local_338 = &ctx->delim_set;
  local_370 = input;
  local_379 = delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              ::is_default(local_338);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_1a8;
  local_1a8._M_unused._M_object = root_component;
  Catch::clara::std::
  vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
  ::vector(&local_308,__l,(allocator_type *)local_2f0);
  local_318 = (unsigned_long *)0x0;
  local_328 = (void *)0x0;
  iStack_320._M_current = (unsigned_long *)0x0;
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = L'\0';
  local_250 = (component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *)0xffffffffffffffff;
  local_330 = pcVar17;
  local_1e8 = root_component;
  std::__cxx11::wstring::reserve((ulong)&local_248);
  local_1d8.current_text_position = (string_size_type *)&local_250;
  local_2f0._0_8_ = local_2f0 + 0x10;
  local_1d8.current_text = &local_248;
  local_1d8.sections = &local_308;
  std::__cxx11::wstring::_M_construct((ulong)local_2f0,L'\x01');
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::wstring::_M_construct((ulong)&local_360,L'\x01');
  pdVar12 = local_338;
  uVar20 = 3;
  if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
    uVar20 = CONCAT44(local_2f0._20_4_,local_2f0._16_4_);
  }
  if (uVar20 < local_360._M_string_length + local_2f0._8_8_) {
    uVar15 = 3;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      uVar15 = local_360.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_360._M_string_length + local_2f0._8_8_) goto LAB_001e13fe;
    pwVar10 = (wstring *)
              std::__cxx11::wstring::replace((ulong)&local_360,0,(wchar_t *)0x0,local_2f0._0_8_);
  }
  else {
LAB_001e13fe:
    pwVar10 = (wstring *)
              std::__cxx11::wstring::_M_append
                        ((wchar_t *)local_2f0,(ulong)local_360._M_dataplus._M_p);
  }
  std::__cxx11::wstring::wstring((wstring *)local_1a8._M_pod_data,pwVar10);
  local_198._16_8_ = local_198 + 0x20;
  std::__cxx11::wstring::_M_construct((ulong)(local_198 + 0x10),L'\x01');
  local_198._48_8_ = &_Stack_158;
  std::__cxx11::wstring::_M_construct((ulong)(local_198 + 0x30),L'\x01');
  _Stack_148._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_138;
  std::__cxx11::wstring::_M_construct((ulong)&_Stack_148,L'\x01');
  pcVar17 = &local_118;
  local_128[0] = pcVar17;
  std::__cxx11::wstring::_M_construct((ulong)local_128,L'\x01');
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_1a8;
  Catch::clara::std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector(&local_1c0,__l_00,(allocator_type *)local_208);
  lVar22 = -0xa0;
  do {
    pcVar2 = pcVar17[-1].children.
             super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pcVar17 != pcVar2) {
      operator_delete(pcVar2,(long)(pcVar17->text)._M_dataplus._M_p * 4 + 4);
    }
    pcVar17 = (component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *)&pcVar17[-1].children;
    lVar22 = lVar22 + 0x20;
  } while (lVar22 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity * 4 + 4);
  }
  pbVar14 = local_370;
  if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
    operator_delete((void *)local_2f0._0_8_,CONCAT44(local_2f0._20_4_,local_2f0._16_4_) * 4 + 4);
  }
  local_378 = (component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *)0x0;
  if (local_330 !=
      (component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
       *)0x0) {
    local_1e0 = (component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 *)((long)&local_330[-1].position + 6);
    local_268 = &(ctx->delim_set).end;
    local_260 = ctx;
    do {
      iVar8 = std::__cxx11::wstring::compare
                        ((ulong)pbVar14,(ulong)local_378,
                         (wstring *)(ctx->delim_set).begin._M_string_length);
      pbVar6 = local_1c0.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar18 = local_1c0.
                super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (iVar8 == 0) {
        parse::anon_class_24_3_f3e5c141::operator()(&local_1d8);
        pbVar14 = local_370;
        pcVar19 = local_378;
        sVar21 = (ctx->delim_set).begin._M_string_length;
        uVar20 = (long)&(local_378->text)._M_dataplus._M_p + sVar21;
        if ((local_379 & local_378 != local_1e0) == 0) {
LAB_001e169f:
          sVar21 = (ctx->delim_set).end._M_string_length;
          local_364 = 0;
          pbVar11 = local_268;
        }
        else {
          uVar16 = local_370->_M_string_length;
          if (uVar16 <= uVar20) {
LAB_001e1e9d:
            uVar15 = std::__throw_out_of_range_fmt
                               ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                ,uVar20,uVar16);
            std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_1a8._M_pod_data);
            std::ios_base::~ios_base((ios_base *)auStack_138);
            Catch::clara::std::
            vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ::~vector(&local_1c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,
                              CONCAT44(local_248.field_2._M_local_buf[1],
                                       local_248.field_2._M_local_buf[0]) * 4 + 4);
            }
            if (local_328 != (void *)0x0) {
              operator_delete(local_328,(long)local_318 - (long)local_328);
            }
            if (local_308.
                super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_308.
                              super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_308.
                                    super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_308.
                                    super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,
                              local_228.field_2._M_allocated_capacity * 4 + 4);
            }
            _Unwind_Resume(uVar15);
          }
          if (sVar21 == 0) {
            uVar20 = 0;
            uVar16 = 0;
            goto LAB_001e1e9d;
          }
          wVar1 = (local_370->_M_dataplus)._M_p[uVar20];
          if (wVar1 != *(pdVar12->begin)._M_dataplus._M_p) goto LAB_001e169f;
          uVar20 = uVar20 + 1;
          local_364 = (undefined4)CONCAT71((uint7)(uint3)((uint)wVar1 >> 8),1);
          pbVar11 = &local_228;
          sVar21 = local_228._M_string_length;
        }
        lVar22 = std::__cxx11::wstring::find
                           ((wchar_t *)local_370,(ulong)(pbVar11->_M_dataplus)._M_p,uVar20);
        if (lVar22 == -1) {
          std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8._M_pod_data);
          pwVar13 = std::operator<<((wostream *)local_1a8._M_pod_data,"Unclosed tag at ");
          std::wostream::_M_insert<unsigned_long>((ulong)pwVar13);
          std::__cxx11::wstringbuf::str();
          std::__cxx11::wstring::operator=((wstring *)local_340,(wstring *)local_2f0);
          if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
            operator_delete((void *)local_2f0._0_8_,
                            CONCAT44(local_2f0._20_4_,local_2f0._16_4_) * 4 + 4);
          }
          std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_1a8._M_pod_data);
          std::ios_base::~ios_base((ios_base *)auStack_138);
          goto LAB_001e1d51;
        }
        std::__cxx11::wstring::wstring
                  ((wstring *)local_1a8._M_pod_data,(wstring *)pbVar14,uVar20,lVar22 - uVar20);
        trim<std::__cxx11::wstring>(&local_360,(mustache *)local_1a8._M_pod_data,s);
        if ((component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             *)local_1a8._M_unused._0_8_ !=
            (component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             *)local_198) {
          operator_delete(local_1a8._M_unused._M_object,local_198._0_8_ * 4 + 4);
        }
        local_2f0._0_8_ = local_2f0 + 0x10;
        local_2f0._8_8_ = 0;
        local_2f0._16_4_ = L'\0';
        local_2f0._32_8_ = local_2f0 + 0x30;
        local_2f0._40_8_ = 0;
        local_2f0._48_4_ = L'\0';
        local_2f0._64_4_ = text;
        local_288.
        super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_288.
        super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_288.
        super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_298 = (element_type *)0x0;
        _Stack_290._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2f0._72_8_ = (element_type *)0x0;
        local_2f0._80_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_270 = (component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                     *)0xffffffffffffffff;
        if ((local_360._M_string_length == 0) || (*local_360._M_dataplus._M_p != L'=')) {
LAB_001e1853:
          parse_tag_contents(local_258,local_364._0_1_,&local_360,
                             (mstch_tag<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                              *)(local_2f0 + 0x20));
LAB_001e1872:
          local_270 = pcVar19;
          Catch::clara::std::
          vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
          ::push_back(&local_308.
                       super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1]->children,
                      (value_type *)local_2f0);
          local_378 = (pointer)(lVar22 + sVar21);
          bVar7 = true;
          if (local_2f0._64_4_ == section_begin_inverted) {
LAB_001e18c0:
            local_1a8._M_unused._M_object =
                 (local_308.
                  super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]->children).
                 super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            std::
            vector<kainjow::mustache::component<std::__cxx11::wstring>*,std::allocator<kainjow::mustache::component<std::__cxx11::wstring>*>>
            ::emplace_back<kainjow::mustache::component<std::__cxx11::wstring>*>
                      ((vector<kainjow::mustache::component<std::__cxx11::wstring>*,std::allocator<kainjow::mustache::component<std::__cxx11::wstring>*>>
                        *)&local_308,
                       (component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                        **)&local_1a8);
            if (iStack_320._M_current == local_318) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_328,
                         iStack_320,(unsigned_long *)&local_378);
            }
            else {
              *iStack_320._M_current = (unsigned_long)local_378;
              iStack_320._M_current = iStack_320._M_current + 1;
            }
          }
          else if (local_2f0._64_4_ == section_end) {
            if ((long)local_308.
                      super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_308.
                      super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start == 8) {
              std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8._M_pod_data);
              pwVar13 = std::operator<<((wostream *)local_1a8._M_pod_data,"Unopened section \"");
              pwVar13 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                  (pwVar13,(wchar_t *)local_2f0._32_8_,local_2f0._40_8_);
              pwVar13 = std::operator<<(pwVar13,"\" at ");
              std::wostream::_M_insert<unsigned_long>((ulong)pwVar13);
              std::__cxx11::wstringbuf::str();
              goto LAB_001e1b48;
            }
            pcVar17 = local_308.
                      super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1];
            pbVar14 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                      operator_new(0x20);
            std::__cxx11::wstring::substr((ulong)pbVar14,(ulong)local_370);
            std::__shared_ptr<std::__cxx11::wstring,(__gnu_cxx::_Lock_policy)2>::
            reset<std::__cxx11::wstring>
                      ((__shared_ptr<std::__cxx11::wstring,(__gnu_cxx::_Lock_policy)2> *)
                       &(pcVar17->tag).section_text,pbVar14);
            local_308.
            super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_308.
                 super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            iStack_320._M_current = iStack_320._M_current + -1;
          }
          else if (local_2f0._64_4_ == section_begin) goto LAB_001e18c0;
        }
        else {
          bVar7 = parse_set_delimiter_tag(local_258,&local_360,local_338);
          if (bVar7) {
            local_379 = delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                        ::is_default(local_338);
            local_2f0._64_4_ = set_delimiter;
            pdVar12 = (delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                       *)operator_new(0x40);
            pcVar5 = local_260;
            (pdVar12->begin)._M_dataplus._M_p = (pointer)&(pdVar12->begin).field_2;
            pwVar3 = (local_260->delim_set).begin._M_dataplus._M_p;
            std::__cxx11::wstring::_M_construct<wchar_t*>
                      ((wstring *)pdVar12,pwVar3,
                       pwVar3 + (local_260->delim_set).begin._M_string_length);
            (pdVar12->end)._M_dataplus._M_p = (pointer)&(pdVar12->end).field_2;
            pwVar3 = (pcVar5->delim_set).end._M_dataplus._M_p;
            std::__cxx11::wstring::_M_construct<wchar_t*>
                      ((wstring *)&pdVar12->end,pwVar3,
                       pwVar3 + (pcVar5->delim_set).end._M_string_length);
            std::
            __shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::wstring>,(__gnu_cxx::_Lock_policy)2>
            ::reset<kainjow::mustache::delimiter_set<std::__cxx11::wstring>>
                      ((__shared_ptr<kainjow::mustache::delimiter_set<std::__cxx11::wstring>,(__gnu_cxx::_Lock_policy)2>
                        *)&local_298,pdVar12);
            if (local_2f0._64_4_ != set_delimiter) goto LAB_001e1853;
            goto LAB_001e1872;
          }
          std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8._M_pod_data);
          pwVar13 = std::operator<<((wostream *)local_1a8._M_pod_data,
                                    "Invalid set delimiter tag at ");
          std::wostream::_M_insert<unsigned_long>((ulong)pwVar13);
          std::__cxx11::wstringbuf::str();
LAB_001e1b48:
          std::__cxx11::wstring::operator=((wstring *)local_340,(wstring *)local_208);
          if (local_208[0] != local_1f8) {
            operator_delete(local_208[0],local_1f8[0] * 4 + 4);
          }
          std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_1a8._M_pod_data);
          std::ios_base::~ios_base((ios_base *)auStack_138);
          bVar7 = false;
        }
        Catch::clara::std::
        vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
        ::~vector(&local_288);
        if (_Stack_290._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (_Stack_290._M_pi);
        }
        pdVar12 = local_338;
        pbVar14 = local_370;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._80_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._80_8_);
        }
        if ((undefined1 *)local_2f0._32_8_ != local_2f0 + 0x30) {
          operator_delete((void *)local_2f0._32_8_,
                          CONCAT44(local_2f0._52_4_,local_2f0._48_4_) * 4 + 4);
        }
        if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
          operator_delete((void *)local_2f0._0_8_,
                          CONCAT44(local_2f0._20_4_,local_2f0._16_4_) * 4 + 4);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        ctx = local_260;
        if (!bVar7) goto LAB_001e1d51;
      }
      else {
        for (; pbVar14 = local_370, pbVar18 != pbVar6; pbVar18 = pbVar18 + 1) {
          iVar8 = std::__cxx11::wstring::compare
                            ((ulong)local_370,(ulong)local_378,(wstring *)pbVar18->_M_string_length)
          ;
          if (iVar8 == 0) {
            parse::anon_class_24_3_f3e5c141::operator()(&local_1d8);
            pcVar19 = local_378;
            local_1a8._M_unused._M_object = local_198;
            pwVar3 = (pbVar18->_M_dataplus)._M_p;
            std::__cxx11::wstring::_M_construct<wchar_t*>
                      ((wstring *)&local_1a8,pwVar3,pwVar3 + pbVar18->_M_string_length);
            local_198._16_8_ = local_198 + 0x20;
            local_198._24_8_ = 0;
            local_198._32_4_ = 0;
            local_198._48_8_ = local_198._48_8_ & 0xffffffff00000000;
            auStack_138._8_8_ = (pointer)0x0;
            local_140 = (undefined1  [8])0x0;
            auStack_138._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_150 = (element_type *)0x0;
            _Stack_148._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_198._56_8_ = 0;
            _Stack_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_128[0] = pcVar19;
            Catch::clara::std::
            vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
            ::push_back(&local_308.
                         super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1]->children,
                        (value_type *)&local_1a8);
            local_378 = (pointer)((long)&(local_378->text)._M_dataplus._M_p +
                                 pbVar18->_M_string_length);
            Catch::clara::std::
            vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
            ::~vector((vector<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                       *)local_140);
            if (_Stack_148._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (_Stack_148._M_pi);
            }
            pbVar14 = local_370;
            if (_Stack_158._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (_Stack_158._M_pi);
            }
            if ((undefined1 *)local_198._16_8_ != local_198 + 0x20) {
              operator_delete((void *)local_198._16_8_,
                              CONCAT44(local_198._36_4_,local_198._32_4_) * 4 + 4);
            }
            if ((component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 *)local_1a8._M_unused._0_8_ !=
                (component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 *)local_198) {
              operator_delete(local_1a8._M_unused._M_object,local_198._0_8_ * 4 + 4);
            }
            goto LAB_001e1ca8;
          }
        }
        if (local_248._M_string_length == 0) {
          local_250 = local_378;
        }
        std::__cxx11::wstring::_M_replace_aux
                  ((ulong)&local_248,local_248._M_string_length,0,L'\x01');
        local_378 = (pointer)((long)&(local_378->text)._M_dataplus._M_p + 1);
      }
LAB_001e1ca8:
    } while (local_378 != local_330);
  }
  parse::anon_class_24_3_f3e5c141::operator()(&local_1d8);
  local_1a8._8_8_ = 0;
  local_1a8._M_unused._M_object = local_340;
  local_198._8_8_ =
       Catch::clara::std::
       _Function_handler<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:786:38)>
       ::_M_invoke;
  local_198._0_8_ =
       Catch::clara::std::
       _Function_handler<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:786:38)>
       ::_M_manager;
  pcVar19 = (local_1e8->children).
            super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar4 = (local_1e8->children).
           super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar19 != pcVar4) {
    do {
      wVar9 = component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              ::walk(pcVar19,(walk_callback *)&local_1a8);
      if (wVar9 != walk) break;
      pcVar19 = pcVar19 + 1;
    } while (pcVar19 != pcVar4);
    if ((code *)local_198._0_8_ == (code *)0x0) goto LAB_001e1d51;
  }
  (*(code *)local_198._0_8_)(&local_1a8,&local_1a8,3);
LAB_001e1d51:
  Catch::clara::std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT44(local_248.field_2._M_local_buf[1],local_248.field_2._M_local_buf[0]) *
                    4 + 4);
  }
  if (local_328 != (void *)0x0) {
    operator_delete(local_328,(long)local_318 - (long)local_328);
  }
  if (local_308.
      super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_308.
                    super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_308.
                          super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.
                          super__Vector_base<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::allocator<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

void parse(const string_type& input, context_internal<string_type>& ctx, component<string_type>& root_component, string_type& error_message) const {
        using string_size_type = typename string_type::size_type;
        using streamstring = std::basic_ostringstream<typename string_type::value_type>;

        const string_type brace_delimiter_end_unescaped(3, '}');
        const string_size_type input_size{input.size()};

        bool current_delimiter_is_brace{ctx.delim_set.is_default()};

        std::vector<component<string_type>*> sections{&root_component};
        std::vector<string_size_type> section_starts;
        string_type current_text;
        string_size_type current_text_position = string_type::npos;

        current_text.reserve(input_size);

        const auto process_current_text = [&current_text, &current_text_position, &sections]() {
            if (!current_text.empty()) {
                const component<string_type> comp{current_text, current_text_position};
                sections.back()->children.push_back(comp);
                current_text.clear();
                current_text_position = string_type::npos;
            }
        };

        const std::vector<string_type> whitespace{
            string_type(1, '\r') + string_type(1, '\n'),
            string_type(1, '\n'),
            string_type(1, '\r'),
            string_type(1, ' '),
            string_type(1, '\t'),
        };

        for (string_size_type input_position = 0; input_position != input_size;) {
            bool parse_tag = false;

            if (input.compare(input_position, ctx.delim_set.begin.size(), ctx.delim_set.begin) == 0) {
                process_current_text();

                // Tag start delimiter
                parse_tag = true;
            } else {
                bool parsed_whitespace = false;
                for (const auto& whitespace_text : whitespace) {
                    if (input.compare(input_position, whitespace_text.size(), whitespace_text) == 0) {
                        process_current_text();

                        const component<string_type> comp{whitespace_text, input_position};
                        sections.back()->children.push_back(comp);
                        input_position += whitespace_text.size();

                        parsed_whitespace = true;
                        break;
                    }
                }

                if (!parsed_whitespace) {
                    if (current_text.empty()) {
                        current_text_position = input_position;
                    }
                    current_text.append(1, input[input_position]);
                    input_position++;
                }
            }

            if (!parse_tag) {
                continue;
            }

            // Find the next tag start delimiter
            const string_size_type tag_location_start = input_position;

            // Find the next tag end delimiter
            string_size_type tag_contents_location{tag_location_start + ctx.delim_set.begin.size()};
            const bool tag_is_unescaped_var{current_delimiter_is_brace && tag_location_start != (input_size - 2) && input.at(tag_contents_location) == ctx.delim_set.begin.at(0)};
            const string_type& current_tag_delimiter_end{tag_is_unescaped_var ? brace_delimiter_end_unescaped : ctx.delim_set.end};
            const auto current_tag_delimiter_end_size = current_tag_delimiter_end.size();
            if (tag_is_unescaped_var) {
                ++tag_contents_location;
            }
            const string_size_type tag_location_end{input.find(current_tag_delimiter_end, tag_contents_location)};
            if (tag_location_end == string_type::npos) {
                streamstring ss;
                ss << "Unclosed tag at " << tag_location_start;
                error_message.assign(ss.str());
                return;
            }

            // Parse tag
            const string_type tag_contents{trim(string_type{input, tag_contents_location, tag_location_end - tag_contents_location})};
            component<string_type> comp;
            if (!tag_contents.empty() && tag_contents[0] == '=') {
                if (!parse_set_delimiter_tag(tag_contents, ctx.delim_set)) {
                    streamstring ss;
                    ss << "Invalid set delimiter tag at " << tag_location_start;
                    error_message.assign(ss.str());
                    return;
                }
                current_delimiter_is_brace = ctx.delim_set.is_default();
                comp.tag.type = tag_type::set_delimiter;
                comp.tag.delim_set.reset(new delimiter_set<string_type>(ctx.delim_set));
            }
            if (comp.tag.type != tag_type::set_delimiter) {
                parse_tag_contents(tag_is_unescaped_var, tag_contents, comp.tag);
            }
            comp.position = tag_location_start;
            sections.back()->children.push_back(comp);

            // Start next search after this tag
            input_position = tag_location_end + current_tag_delimiter_end_size;

            // Push or pop sections
            if (comp.tag.is_section_begin()) {
                sections.push_back(&sections.back()->children.back());
                section_starts.push_back(input_position);
            } else if (comp.tag.is_section_end()) {
                if (sections.size() == 1) {
                    streamstring ss;
                    ss << "Unopened section \"" << comp.tag.name << "\" at " << comp.position;
                    error_message.assign(ss.str());
                    return;
                }
                sections.back()->tag.section_text.reset(new string_type(input.substr(section_starts.back(), tag_location_start - section_starts.back())));
                sections.pop_back();
                section_starts.pop_back();
            }
        }

        process_current_text();

        // Check for sections without an ending tag
        root_component.walk_children([&error_message](component<string_type>& comp) -> typename component<string_type>::walk_control {
            if (!comp.tag.is_section_begin()) {
                return component<string_type>::walk_control::walk;
            }
            if (comp.children.empty() || !comp.children.back().tag.is_section_end() || comp.children.back().tag.name != comp.tag.name) {
                streamstring ss;
                ss << "Unclosed section \"" << comp.tag.name << "\" at " << comp.position;
                error_message.assign(ss.str());
                return component<string_type>::walk_control::stop;
            }
            comp.children.pop_back(); // remove now useless end section component
            return component<string_type>::walk_control::walk;
        });
        if (!error_message.empty()) {
            return;
        }
    }